

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_api.c
# Opt level: O3

amqp_rpc_reply_t *
amqp_connection_close
          (amqp_rpc_reply_t *__return_storage_ptr__,amqp_connection_state_t state,int code)

{
  int iVar1;
  amqp_method_number_t replies [2];
  char codestr [13];
  amqp_channel_close_t req;
  amqp_method_number_t local_50 [2];
  char local_45 [13];
  undefined2 local_38 [4];
  long local_30;
  char *local_28;
  undefined4 local_20;
  
  local_50[0] = 0xa0033;
  local_50[1] = 0;
  if ((uint)code < 0x10000) {
    local_38[0] = (undefined2)code;
    local_28 = local_45;
    iVar1 = sprintf(local_28,"%d");
    local_30 = (long)iVar1;
    local_20 = 0;
    amqp_simple_rpc(__return_storage_ptr__,state,0,0xa0032,local_50,local_38);
  }
  else {
    __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    __return_storage_ptr__->library_error = -10;
  }
  return __return_storage_ptr__;
}

Assistant:

amqp_rpc_reply_t amqp_connection_close(amqp_connection_state_t state,
                                       int code) {
  char codestr[13];
  amqp_method_number_t replies[2] = {AMQP_CONNECTION_CLOSE_OK_METHOD, 0};
  amqp_channel_close_t req;

  if (code < 0 || code > UINT16_MAX) {
    return amqp_rpc_reply_error(AMQP_STATUS_INVALID_PARAMETER);
  }

  req.reply_code = (uint16_t)code;
  req.reply_text.bytes = codestr;
  req.reply_text.len = sprintf(codestr, "%d", code);
  req.class_id = 0;
  req.method_id = 0;

  return amqp_simple_rpc(state, 0, AMQP_CONNECTION_CLOSE_METHOD, replies, &req);
}